

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCAABB.cpp
# Opt level: O1

bool chrono::collision::CHAABB::AABB_Overlap(ChMatrix33<double> *B,Vector *T,CHAABB *b1,CHAABB *b2)

{
  double dVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ChMatrix33<double> Bf;
  Vector local_60;
  ChMatrix33<double> local_48;
  
  dVar1 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar1;
  auVar13._0_8_ = -dVar1;
  auVar13._8_8_ = 0x8000000000000000;
  auVar3 = vmaxsd_avx(auVar13,auVar3);
  local_48.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar3._0_8_ + 1e-06;
  dVar1 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar1;
  auVar14._0_8_ = -dVar1;
  auVar14._8_8_ = 0x8000000000000000;
  auVar3 = vmaxsd_avx(auVar14,auVar4);
  local_48.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar3._0_8_ + 1e-06;
  dVar1 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar1;
  auVar15._0_8_ = -dVar1;
  auVar15._8_8_ = 0x8000000000000000;
  auVar3 = vmaxsd_avx(auVar15,auVar5);
  local_48.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar3._0_8_ + 1e-06;
  dVar1 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1;
  auVar16._0_8_ = -dVar1;
  auVar16._8_8_ = 0x8000000000000000;
  auVar3 = vmaxsd_avx(auVar16,auVar6);
  local_48.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       auVar3._0_8_ + 1e-06;
  dVar1 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar1;
  auVar17._0_8_ = -dVar1;
  auVar17._8_8_ = 0x8000000000000000;
  auVar3 = vmaxsd_avx(auVar17,auVar7);
  local_48.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar3._0_8_ + 1e-06;
  dVar1 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar1;
  auVar18._0_8_ = -dVar1;
  auVar18._8_8_ = 0x8000000000000000;
  auVar3 = vmaxsd_avx(auVar18,auVar8);
  local_48.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar3._0_8_ + 1e-06;
  dVar1 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar1;
  auVar19._0_8_ = -dVar1;
  auVar19._8_8_ = 0x8000000000000000;
  auVar3 = vmaxsd_avx(auVar19,auVar9);
  local_48.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       auVar3._0_8_ + 1e-06;
  dVar1 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar1;
  auVar20._0_8_ = -dVar1;
  auVar20._8_8_ = 0x8000000000000000;
  auVar3 = vmaxsd_avx(auVar20,auVar10);
  local_48.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar3._0_8_ + 1e-06;
  dVar1 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1;
  auVar12._0_8_ = -dVar1;
  auVar12._8_8_ = 0x8000000000000000;
  auVar3 = vmaxsd_avx(auVar12,auVar11);
  local_48.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar3._0_8_ + 1e-06;
  local_60.m_data[0] = T->m_data[0];
  local_60.m_data[1] = T->m_data[1];
  local_60.m_data[2] = T->m_data[2];
  bVar2 = AABB_Overlap(B,&local_48,&local_60,b1,b2);
  return bVar2;
}

Assistant:

bool CHAABB::AABB_Overlap(ChMatrix33<>& B, Vector T, CHAABB* b1, CHAABB* b2) {
    ChMatrix33<> Bf;
    const double reps = (double)1e-6;

    // Bf = fabs(B)
    Bf(0, 0) = myfabs(B(0, 0));
    Bf(0, 0) += reps;
    Bf(0, 1) = myfabs(B(0, 1));
    Bf(0, 1) += reps;
    Bf(0, 2) = myfabs(B(0, 2));
    Bf(0, 2) += reps;
    Bf(1, 0) = myfabs(B(1, 0));
    Bf(1, 0) += reps;
    Bf(1, 1) = myfabs(B(1, 1));
    Bf(1, 1) += reps;
    Bf(1, 2) = myfabs(B(1, 2));
    Bf(1, 2) += reps;
    Bf(2, 0) = myfabs(B(2, 0));
    Bf(2, 0) += reps;
    Bf(2, 1) = myfabs(B(2, 1));
    Bf(2, 1) += reps;
    Bf(2, 2) = myfabs(B(2, 2));
    Bf(2, 2) += reps;

    return AABB_Overlap(B, Bf, T, b1, b2);
}